

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

bool __thiscall CScript::IsPayToAnchor(CScript *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = (this->super_CScriptBase)._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  if (uVar2 == 4) {
    if (0x1c < uVar1) {
      this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if ((((this->super_CScriptBase)._union.direct[0] == 'Q') &&
        ((this->super_CScriptBase)._union.direct[1] == '\x02')) &&
       ((this->super_CScriptBase)._union.direct[2] == 'N')) {
      bVar3 = (this->super_CScriptBase)._union.direct[3] == 's';
      goto LAB_00159bda;
    }
  }
  bVar3 = false;
LAB_00159bda:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToAnchor() const
{
    return (this->size() == 4 &&
        (*this)[0] == OP_1 &&
        (*this)[1] == 0x02 &&
        (*this)[2] == 0x4e &&
        (*this)[3] == 0x73);
}